

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_0::BorderPixel::Render(BorderPixel *this,Screen *screen)

{
  int y;
  uint8_t uVar1;
  Color CVar2;
  Pixel *pPVar3;
  int iVar4;
  
  (**(code **)((long)((((this->super_Node).children_.
                        super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     _vptr_Node + 0x20))();
  iVar4 = (this->super_Node).box_.x_min;
  if ((iVar4 < (this->super_Node).box_.x_max) &&
     (y = (this->super_Node).box_.y_min, y < (this->super_Node).box_.y_max)) {
    pPVar3 = Screen::PixelAt(screen,iVar4,y);
    uVar1 = (this->pixel_).hyperlink;
    pPVar3->field_0x0 = (this->pixel_).field_0x0;
    pPVar3->hyperlink = uVar1;
    std::__cxx11::string::_M_assign((string *)&pPVar3->character);
    CVar2 = (this->pixel_).foreground_color;
    pPVar3->background_color = (this->pixel_).background_color;
    pPVar3->foreground_color = CVar2;
    pPVar3 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_min);
    uVar1 = (this->pixel_).hyperlink;
    pPVar3->field_0x0 = (this->pixel_).field_0x0;
    pPVar3->hyperlink = uVar1;
    std::__cxx11::string::_M_assign((string *)&pPVar3->character);
    CVar2 = (this->pixel_).foreground_color;
    pPVar3->background_color = (this->pixel_).background_color;
    pPVar3->foreground_color = CVar2;
    pPVar3 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_max);
    uVar1 = (this->pixel_).hyperlink;
    pPVar3->field_0x0 = (this->pixel_).field_0x0;
    pPVar3->hyperlink = uVar1;
    std::__cxx11::string::_M_assign((string *)&pPVar3->character);
    CVar2 = (this->pixel_).foreground_color;
    pPVar3->background_color = (this->pixel_).background_color;
    pPVar3->foreground_color = CVar2;
    pPVar3 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_max);
    uVar1 = (this->pixel_).hyperlink;
    pPVar3->field_0x0 = (this->pixel_).field_0x0;
    pPVar3->hyperlink = uVar1;
    std::__cxx11::string::_M_assign((string *)&pPVar3->character);
    CVar2 = (this->pixel_).foreground_color;
    pPVar3->background_color = (this->pixel_).background_color;
    pPVar3->foreground_color = CVar2;
    iVar4 = (this->super_Node).box_.x_min;
    while (iVar4 = iVar4 + 1, iVar4 < (this->super_Node).box_.x_max) {
      pPVar3 = Screen::PixelAt(screen,iVar4,(this->super_Node).box_.y_min);
      uVar1 = (this->pixel_).hyperlink;
      pPVar3->field_0x0 = (this->pixel_).field_0x0;
      pPVar3->hyperlink = uVar1;
      std::__cxx11::string::_M_assign((string *)&pPVar3->character);
      CVar2 = (this->pixel_).foreground_color;
      pPVar3->background_color = (this->pixel_).background_color;
      pPVar3->foreground_color = CVar2;
      pPVar3 = Screen::PixelAt(screen,iVar4,(this->super_Node).box_.y_max);
      uVar1 = (this->pixel_).hyperlink;
      pPVar3->field_0x0 = (this->pixel_).field_0x0;
      pPVar3->hyperlink = uVar1;
      std::__cxx11::string::_M_assign((string *)&pPVar3->character);
      CVar2 = (this->pixel_).foreground_color;
      pPVar3->background_color = (this->pixel_).background_color;
      pPVar3->foreground_color = CVar2;
    }
    iVar4 = (this->super_Node).box_.y_min;
    while (iVar4 = iVar4 + 1, iVar4 < (this->super_Node).box_.y_max) {
      pPVar3 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,iVar4);
      uVar1 = (this->pixel_).hyperlink;
      pPVar3->field_0x0 = (this->pixel_).field_0x0;
      pPVar3->hyperlink = uVar1;
      std::__cxx11::string::_M_assign((string *)&pPVar3->character);
      CVar2 = (this->pixel_).foreground_color;
      pPVar3->background_color = (this->pixel_).background_color;
      pPVar3->foreground_color = CVar2;
      pPVar3 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,iVar4);
      uVar1 = (this->pixel_).hyperlink;
      pPVar3->field_0x0 = (this->pixel_).field_0x0;
      pPVar3->hyperlink = uVar1;
      std::__cxx11::string::_M_assign((string *)&pPVar3->character);
      CVar2 = (this->pixel_).foreground_color;
      pPVar3->background_color = (this->pixel_).background_color;
      pPVar3->foreground_color = CVar2;
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max) {
      return;
    }

    screen.PixelAt(box_.x_min, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_min, box_.y_max) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_max) = pixel_;

    for (int x = box_.x_min + 1; x < box_.x_max; ++x) {
      screen.PixelAt(x, box_.y_min) = pixel_;
      screen.PixelAt(x, box_.y_max) = pixel_;
    }
    for (int y = box_.y_min + 1; y < box_.y_max; ++y) {
      screen.PixelAt(box_.x_min, y) = pixel_;
      screen.PixelAt(box_.x_max, y) = pixel_;
    }
  }